

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzpyramid.cpp
# Opt level: O2

void pztopology::TPZPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
  local_350;
  TPZFMatrix<Fad<double>_> *local_340;
  Fad<double> *local_338;
  Fad<double> *local_330;
  double dStack_328;
  Fad<double> *local_320;
  Fad<double> lmexmez;
  Fad<double> lmeymez;
  Fad<double> lmez;
  Fad<double> *local_2b8;
  Fad<double> *local_2b0;
  Fad<double> **local_2a8;
  Fad<double> *local_2a0;
  Fad<double> *local_298;
  Fad<double> *local_290;
  undefined1 local_288 [16];
  Fad<double> lmaxmez;
  Fad<double> lmaymez;
  Fad<double> T1yz;
  Fad<double> T1xz;
  Fad<double> T0yz;
  Fad<double> eta;
  Fad<double> local_190;
  Fad<double> local_170;
  Fad<double> local_150;
  Fad<double> local_130;
  Fad<double> T0xz;
  Fad<double> zeta;
  Fad<double> xi;
  Fad<double> local_b0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  local_340 = dphi;
  Fad<double>::Fad(&xi,loc->fStore);
  Fad<double>::Fad(&eta,loc->fStore + 1);
  Fad<double>::Fad(&zeta,loc->fStore + 2);
  if (1.0 < zeta.val_) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
               ,0x11e);
  }
  T1xz.dx_.num_elts = 0;
  T1xz.dx_._4_4_ = 0x3ff00000;
  T1xz.dx_.ptr_to_data = (double *)0x0;
  T0yz.defaultVal = (double)&lmexmez;
  lmez.val_ = (double)&T0yz;
  T0yz.dx_.num_elts = 0;
  T0yz.dx_._4_4_ = 0x3fe00000;
  T0yz.dx_.ptr_to_data = (double *)0x0;
  T1yz.dx_.num_elts = 0;
  T1yz.dx_._4_4_ = 0x3ff00000;
  T1yz.dx_.ptr_to_data = (double *)0x0;
  lmexmez.val_ = (double)&T1xz;
  lmexmez.dx_._0_8_ = &xi;
  lmez.dx_._0_8_ = &T1yz;
  T1yz.defaultVal = (double)&zeta;
  T1xz.defaultVal = (double)&zeta;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (&T0xz,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)&lmez);
  T1yz.dx_.num_elts = 0;
  T1yz.dx_._4_4_ = 0x3ff00000;
  T1yz.dx_.ptr_to_data = (double *)0x0;
  T1xz.defaultVal = (double)&lmeymez;
  lmeymez.dx_._0_8_ = &eta;
  T1xz.dx_.num_elts = 0;
  T1xz.dx_._4_4_ = 0x3fe00000;
  T1xz.dx_.ptr_to_data = (double *)0x0;
  lmez.dx_.num_elts = 0;
  lmez.dx_._4_4_ = 0x3ff00000;
  lmez.dx_.ptr_to_data = (double *)0x0;
  lmexmez.val_ = (double)&T1xz;
  lmexmez.dx_._0_8_ = &lmez;
  lmeymez.val_ = (double)&T1yz;
  lmez.defaultVal = (double)&zeta;
  T1yz.defaultVal = (double)&zeta;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (&T0yz,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)&lmexmez);
  lmez.dx_.num_elts = 0;
  lmez.dx_._4_4_ = 0x3ff00000;
  lmez.dx_.ptr_to_data = (double *)0x0;
  T1yz.defaultVal = (double)&lmaxmez;
  T1yz.dx_.num_elts = 0;
  T1yz.dx_._4_4_ = 0x3fe00000;
  T1yz.dx_.ptr_to_data = (double *)0x0;
  lmexmez.dx_.num_elts = 0;
  lmexmez.dx_._4_4_ = 0x3ff00000;
  lmexmez.dx_.ptr_to_data = (double *)0x0;
  lmexmez.defaultVal = (double)&zeta;
  lmeymez.val_ = (double)&T1yz;
  lmeymez.dx_._0_8_ = &lmexmez;
  lmez.defaultVal = (double)&zeta;
  lmaxmez.val_ = (double)&lmez;
  lmaxmez.dx_._0_8_ = &xi;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (&T1xz,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)&lmeymez);
  lmexmez.dx_.num_elts = 0;
  lmexmez.dx_._4_4_ = 0x3ff00000;
  lmexmez.dx_.ptr_to_data = (double *)0x0;
  lmez.defaultVal = (double)&lmaymez;
  lmaymez.dx_._0_8_ = &eta;
  lmez.dx_.num_elts = 0;
  lmez.dx_._4_4_ = 0x3fe00000;
  lmez.dx_.ptr_to_data = (double *)0x0;
  lmeymez.dx_.num_elts = 0;
  lmeymez.dx_._4_4_ = 0x3ff00000;
  lmeymez.dx_.ptr_to_data = (double *)0x0;
  lmexmez.defaultVal = (double)&zeta;
  lmeymez.defaultVal = (double)&zeta;
  lmaxmez.val_ = (double)&lmez;
  lmaxmez.dx_._0_8_ = &lmeymez;
  lmaymez.val_ = (double)&lmexmez;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>>>,FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>>>
            (&T1yz,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
                    *)&lmaxmez);
  Fad<double>::Fad(&local_50,&xi);
  Fad<double>::~Fad(&local_50);
  if (ABS(local_50.val_) < 1e-12) {
    lmez.val_ = 0.5;
    Fad<double>::operator=<double,_nullptr>(&T0xz,&lmez.val_);
    lmez.val_ = 0.5;
    Fad<double>::operator=<double,_nullptr>(&T1xz,&lmez.val_);
  }
  Fad<double>::Fad(&local_70,&eta);
  Fad<double>::~Fad(&local_70);
  if (ABS(local_70.val_) < 1e-12) {
    lmez.val_ = 0.5;
    Fad<double>::operator=<double,_nullptr>(&T0yz,&lmez.val_);
    lmez.val_ = 0.5;
    Fad<double>::operator=<double,_nullptr>(&T1yz,&lmez.val_);
  }
  lmexmez.dx_.num_elts = 0;
  lmexmez.dx_._4_4_ = 0x3ff00000;
  lmexmez.dx_.ptr_to_data = (double *)0x0;
  lmexmez.defaultVal = (double)&zeta;
  Fad<double>::Fad<FadBinaryMinus<FadCst<double>,Fad<double>>>
            (&lmez,(FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&lmexmez);
  lmeymez.dx_._0_8_ = &T0yz;
  lmexmez.val_ = (double)&lmeymez;
  lmexmez.dx_._0_8_ = &lmez;
  lmeymez.val_ = (double)&T0xz;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&lmexmez);
  lmeymez.dx_._0_8_ = &T0yz;
  lmexmez.val_ = (double)&lmeymez;
  lmexmez.dx_._0_8_ = &lmez;
  lmeymez.val_ = (double)&T1xz;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&lmexmez);
  lmeymez.dx_._0_8_ = &T1yz;
  lmexmez.val_ = (double)&lmeymez;
  lmexmez.dx_._0_8_ = &lmez;
  lmeymez.val_ = (double)&T1xz;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,2,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&lmexmez);
  lmeymez.dx_._0_8_ = &T1yz;
  lmexmez.val_ = (double)&lmeymez;
  lmexmez.dx_._0_8_ = &lmez;
  lmeymez.val_ = (double)&T0xz;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,3,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&lmexmez);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,4,0);
  Fad<double>::operator=(pFVar1,&zeta);
  lmeymez.dx_.num_elts = 0;
  lmeymez.dx_._4_4_ = 0x3ff00000;
  lmeymez.dx_.ptr_to_data = (double *)0x0;
  lmeymez.defaultVal = (double)&xi;
  lmaxmez.val_ = (double)&lmeymez;
  lmaxmez.dx_._0_8_ = &zeta;
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>
            (&lmexmez,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)&lmaxmez);
  lmaxmez.dx_.num_elts = 0;
  lmaxmez.dx_._4_4_ = 0x3ff00000;
  lmaxmez.dx_.ptr_to_data = (double *)0x0;
  lmaxmez.defaultVal = (double)&eta;
  lmaymez.val_ = (double)&lmaxmez;
  lmaymez.dx_._0_8_ = &zeta;
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,Fad<double>>>,Fad<double>>>
            (&lmeymez,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)&lmaymez);
  lmaymez.dx_.num_elts = 0;
  lmaymez.dx_._4_4_ = 0x3ff00000;
  lmaymez.dx_.ptr_to_data = (double *)0x0;
  local_338 = &lmaymez;
  local_330 = &zeta;
  lmaymez.defaultVal = (double)&xi;
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,Fad<double>>>,Fad<double>>>
            (&lmaxmez,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                       *)&local_338);
  local_330 = (Fad<double> *)0x3ff0000000000000;
  dStack_328 = 0.0;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &zeta;
  local_320 = &eta;
  Fad<double>::Fad<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<double>,Fad<double>>>,Fad<double>>>
            (&lmaymez,&local_350);
  Fad<double>::Fad(&local_130,&lmez);
  if (ABS(local_130.val_) < 1e-12) {
    Fad<double>::Fad(&local_150,&lmexmez);
    if (1e-12 <= ABS(local_150.val_)) {
      Fad<double>::Fad(&local_170,&lmeymez);
      if (1e-12 <= ABS(local_170.val_)) {
        Fad<double>::Fad(&local_190,&lmaxmez);
        if (1e-12 <= ABS(local_190.val_)) {
          Fad<double>::Fad(&local_90,&lmaymez);
          Fad<double>::~Fad(&local_90);
          Fad<double>::~Fad(&local_190);
          Fad<double>::~Fad(&local_170);
          Fad<double>::~Fad(&local_150);
          Fad<double>::~Fad(&local_130);
          if (1e-12 <= ABS(local_90.val_)) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Topology/tpzpyramid.cpp"
                       ,0x13c);
          }
          goto LAB_00e1ae3d;
        }
        Fad<double>::~Fad(&local_190);
      }
      Fad<double>::~Fad(&local_170);
    }
    Fad<double>::~Fad(&local_150);
  }
  Fad<double>::~Fad(&local_130);
LAB_00e1ae3d:
  Fad<double>::Fad(&local_b0,&lmez);
  Fad<double>::~Fad(&local_b0);
  if (ABS(local_b0.val_) < 1e-12) {
    local_338 = (Fad<double> *)0x3feff7ced916872b;
    Fad<double>::operator=<double,_nullptr>(&lmexmez,(double *)&local_338);
    local_338 = (Fad<double> *)0x3feff7ced916872b;
    Fad<double>::operator=<double,_nullptr>(&lmeymez,(double *)&local_338);
    local_338 = (Fad<double> *)0x3feff7ced916872b;
    Fad<double>::operator=<double,_nullptr>(&lmaxmez,(double *)&local_338);
    local_338 = (Fad<double> *)0x3feff7ced916872b;
    Fad<double>::operator=<double,_nullptr>(&lmaymez,(double *)&local_338);
    local_338 = (Fad<double> *)0x3f50624dd2f1a9fc;
    Fad<double>::operator=<double,_nullptr>(&lmez,(double *)&local_338);
  }
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmeymez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,0,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  local_320 = &lmexmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_2b0 = &lmeymez;
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  local_320 = (Fad<double> *)local_288;
  local_2b8 = &lmexmez;
  local_2a8 = &local_2b8;
  local_2a0 = &lmez;
  local_298 = local_2b0;
  local_290 = &lmexmez;
  local_288._0_8_ = &local_298;
  local_288._8_8_ = &local_2a8;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,2,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0x3fd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmeymez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,0,1);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmaxmez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,1,1);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_2b0 = &lmeymez;
  local_2b8 = &lmaxmez;
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  local_320 = (Fad<double> *)local_288;
  local_2a8 = &local_2b8;
  local_2a0 = &lmez;
  local_298 = local_2b0;
  local_290 = local_2b8;
  local_288._0_8_ = &local_298;
  local_288._8_8_ = &local_2a8;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,2,1);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0x3fd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmaymez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,0,2);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0x3fd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmaxmez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,1,2);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_2b0 = &lmaymez;
  local_2b8 = &lmaxmez;
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  local_320 = (Fad<double> *)local_288;
  local_2a8 = &local_2b8;
  local_2a0 = &lmez;
  local_298 = local_2b0;
  local_290 = local_2b8;
  local_288._0_8_ = &local_298;
  local_288._8_8_ = &local_2a8;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,2,2);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmaymez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,0,3);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_330 = (Fad<double> *)0x3fd0000000000000;
  dStack_328 = 0.0;
  local_320 = &lmexmez;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,1,3);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_2b0 = &lmaymez;
  local_2b8 = &lmexmez;
  local_330 = (Fad<double> *)0xbfd0000000000000;
  dStack_328 = 0.0;
  local_350.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_338;
  local_350.fadexpr_.right_ = &lmez;
  local_320 = (Fad<double> *)local_288;
  local_2a8 = &local_2b8;
  local_2a0 = &lmez;
  local_298 = local_2b0;
  local_290 = local_2b8;
  local_288._0_8_ = &local_298;
  local_288._8_8_ = &local_2a8;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,2,3);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                     *)&local_350);
  local_338 = (Fad<double> *)0x0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,0,4);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_338);
  local_338 = (Fad<double> *)0x0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,1,4);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_338);
  local_338 = (Fad<double> *)0x3ff0000000000000;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(local_340,2,4);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)&local_338);
  Fad<double>::~Fad(&lmaymez);
  Fad<double>::~Fad(&lmaxmez);
  Fad<double>::~Fad(&lmeymez);
  Fad<double>::~Fad(&lmexmez);
  Fad<double>::~Fad(&lmez);
  Fad<double>::~Fad(&T1yz);
  Fad<double>::~Fad(&T1xz);
  Fad<double>::~Fad(&T0yz);
  Fad<double>::~Fad(&T0xz);
  Fad<double>::~Fad(&zeta);
  Fad<double>::~Fad(&eta);
  Fad<double>::~Fad(&xi);
  return;
}

Assistant:

inline void TPZPyramid::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
        T xi = loc[0], eta = loc[1] , zeta  = loc[2];

        if (zeta> 1.) {
            DebugStop();
        }

        T T0xz = .5*(1.-zeta-xi) / (1.-zeta);
        T T0yz = .5*(1.-zeta-eta) / (1.-zeta);
        T T1xz = .5*(1.-zeta+xi) / (1.-zeta);
        T T1yz = .5*(1.-zeta+eta) / (1.-zeta);
        if (IsZero(xi)) {
            T0xz = 0.5;
            T1xz = 0.5;
        }
        if (IsZero(eta)) {
            T0yz = 0.5;
            T1yz = 0.5;
        }
        T lmez = (1.-zeta);

        phi(0,0)  = T0xz*T0yz*lmez;
        phi(1,0)  = T1xz*T0yz*lmez;
        phi(2,0)  = T1xz*T1yz*lmez;
        phi(3,0)  = T0xz*T1yz*lmez;
        phi(4,0)  = zeta;

        T lmexmez = 1.-xi-zeta;
        T lmeymez = 1.-eta-zeta;
        T lmaxmez = 1.+xi-zeta;
        T lmaymez = 1.+eta-zeta;

        if (IsZero(lmez) && !IsZero(lmexmez) && !IsZero(lmeymez) &&
            !IsZero(lmaxmez) && !IsZero(lmaymez)) {
            DebugStop();
        }
        if (IsZero(lmez)) {
            lmexmez = 0.999;
            lmeymez = 0.999;
            lmaxmez = 0.999;
            lmaymez = 0.999;
            lmez = 0.001;
        }

        dphi(0,0) = -.25*lmeymez / lmez;
        dphi(1,0) = -.25*lmexmez / lmez;
        dphi(2,0) = -.25*(lmeymez+lmexmez-lmexmez*lmeymez/lmez) / lmez;
        dphi(0,1) =  .25*lmeymez / lmez;
        dphi(1,1) = -.25*lmaxmez / lmez;
        dphi(2,1) = -.25*(lmeymez+lmaxmez-lmaxmez*lmeymez/lmez) / lmez;
        dphi(0,2) =  .25*lmaymez / lmez;
        dphi(1,2) =  .25*lmaxmez / lmez;
        dphi(2,2) = -.25*(lmaymez+lmaxmez-lmaxmez*lmaymez/lmez) / lmez;
        dphi(0,3) = -.25*lmaymez / lmez;
        dphi(1,3) =  .25*lmexmez / lmez;
        dphi(2,3) = -.25*(lmaymez+lmexmez-lmexmez*lmaymez/lmez) / lmez;
        dphi(0,4) =  0.0;
        dphi(1,4) =  0.0;
        dphi(2,4) =  1.0;

    }